

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O2

int randomx_blake2b_long(void *pout,size_t outlen,void *in,size_t inlen)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__dest;
  size_t outlen_00;
  int local_1ac;
  uint8_t out_buffer [64];
  uint8_t local_168 [8];
  uint8_t auStack_160 [8];
  uint8_t local_158 [8];
  uint8_t auStack_150 [8];
  uint8_t local_148 [8];
  uint8_t auStack_140 [8];
  uint8_t local_138 [8];
  uint8_t auStack_130 [16];
  blake2b_state blake_state;
  
  iVar2 = -1;
  if (outlen >> 0x20 == 0) {
    iVar1 = (int)outlen;
    local_1ac = iVar1;
    if (outlen < 0x41) {
      iVar1 = randomx_blake2b_init(&blake_state,outlen);
      if (((-1 < iVar1) && (iVar1 = randomx_blake2b_update(&blake_state,&local_1ac,4), -1 < iVar1))
         && (iVar1 = randomx_blake2b_update(&blake_state,in,inlen), -1 < iVar1)) {
        iVar2 = randomx_blake2b_final(&blake_state,pout,outlen);
      }
    }
    else {
      iVar3 = randomx_blake2b_init(&blake_state,0x40);
      iVar2 = -1;
      if ((((-1 < iVar3) && (iVar3 = randomx_blake2b_update(&blake_state,&local_1ac,4), -1 < iVar3))
          && (iVar3 = randomx_blake2b_update(&blake_state,in,inlen), -1 < iVar3)) &&
         (iVar3 = randomx_blake2b_final(&blake_state,out_buffer,0x40), -1 < iVar3)) {
        __dest = (void *)((long)pout + 0x20);
        outlen_00 = (size_t)(iVar1 - 0x20);
        do {
          *(undefined8 *)((long)__dest + -0x10) = out_buffer._16_8_;
          *(undefined8 *)((long)__dest + -8) = out_buffer._24_8_;
          *(undefined8 *)((long)__dest + -0x20) = out_buffer._0_8_;
          *(undefined8 *)((long)__dest + -0x18) = out_buffer._8_8_;
          local_168[0] = out_buffer[0];
          local_168[1] = out_buffer[1];
          local_168[2] = out_buffer[2];
          local_168[3] = out_buffer[3];
          local_168[4] = out_buffer[4];
          local_168[5] = out_buffer[5];
          local_168[6] = out_buffer[6];
          local_168[7] = out_buffer[7];
          auStack_160[0] = out_buffer[8];
          auStack_160[1] = out_buffer[9];
          auStack_160[2] = out_buffer[10];
          auStack_160[3] = out_buffer[0xb];
          auStack_160[4] = out_buffer[0xc];
          auStack_160[5] = out_buffer[0xd];
          auStack_160[6] = out_buffer[0xe];
          auStack_160[7] = out_buffer[0xf];
          local_158[0] = out_buffer[0x10];
          local_158[1] = out_buffer[0x11];
          local_158[2] = out_buffer[0x12];
          local_158[3] = out_buffer[0x13];
          local_158[4] = out_buffer[0x14];
          local_158[5] = out_buffer[0x15];
          local_158[6] = out_buffer[0x16];
          local_158[7] = out_buffer[0x17];
          auStack_150[0] = out_buffer[0x18];
          auStack_150[1] = out_buffer[0x19];
          auStack_150[2] = out_buffer[0x1a];
          auStack_150[3] = out_buffer[0x1b];
          auStack_150[4] = out_buffer[0x1c];
          auStack_150[5] = out_buffer[0x1d];
          auStack_150[6] = out_buffer[0x1e];
          auStack_150[7] = out_buffer[0x1f];
          local_148[0] = out_buffer[0x20];
          local_148[1] = out_buffer[0x21];
          local_148[2] = out_buffer[0x22];
          local_148[3] = out_buffer[0x23];
          local_148[4] = out_buffer[0x24];
          local_148[5] = out_buffer[0x25];
          local_148[6] = out_buffer[0x26];
          local_148[7] = out_buffer[0x27];
          auStack_140[0] = out_buffer[0x28];
          auStack_140[1] = out_buffer[0x29];
          auStack_140[2] = out_buffer[0x2a];
          auStack_140[3] = out_buffer[0x2b];
          auStack_140[4] = out_buffer[0x2c];
          auStack_140[5] = out_buffer[0x2d];
          auStack_140[6] = out_buffer[0x2e];
          auStack_140[7] = out_buffer[0x2f];
          local_138[0] = out_buffer[0x30];
          local_138[1] = out_buffer[0x31];
          local_138[2] = out_buffer[0x32];
          local_138[3] = out_buffer[0x33];
          local_138[4] = out_buffer[0x34];
          local_138[5] = out_buffer[0x35];
          local_138[6] = out_buffer[0x36];
          local_138[7] = out_buffer[0x37];
          auStack_130[0] = out_buffer[0x38];
          auStack_130[1] = out_buffer[0x39];
          auStack_130[2] = out_buffer[0x3a];
          auStack_130[3] = out_buffer[0x3b];
          auStack_130[4] = out_buffer[0x3c];
          auStack_130[5] = out_buffer[0x3d];
          auStack_130[6] = out_buffer[0x3e];
          auStack_130[7] = out_buffer[0x3f];
          if ((uint)outlen_00 < 0x41) {
            iVar2 = randomx_blake2b(out_buffer,outlen_00,local_168,0x40,(void *)0x0,0);
            if (iVar2 < 0) {
              return -1;
            }
            memcpy(__dest,out_buffer,outlen_00);
            return 0;
          }
          iVar1 = randomx_blake2b(out_buffer,0x40,local_168,0x40,(void *)0x0,0);
          __dest = (void *)((long)__dest + 0x20);
          outlen_00 = outlen_00 - 0x20;
        } while (-1 < iVar1);
      }
    }
  }
  return iVar2;
}

Assistant:

int blake2b_long(void *pout, size_t outlen, const void *in, size_t inlen) {
	uint8_t *out = (uint8_t *)pout;
	blake2b_state blake_state;
	uint8_t outlen_bytes[sizeof(uint32_t)] = { 0 };
	int ret = -1;

	if (outlen > UINT32_MAX) {
		goto fail;
	}

	/* Ensure little-endian byte order! */
	store32(outlen_bytes, (uint32_t)outlen);

#define TRY(statement)                                                         \
    do {                                                                       \
        ret = statement;                                                       \
        if (ret < 0) {                                                         \
            goto fail;                                                         \
        }                                                                      \
    } while ((void)0, 0)

	if (outlen <= BLAKE2B_OUTBYTES) {
		TRY(blake2b_init(&blake_state, outlen));
		TRY(blake2b_update(&blake_state, outlen_bytes, sizeof(outlen_bytes)));
		TRY(blake2b_update(&blake_state, in, inlen));
		TRY(blake2b_final(&blake_state, out, outlen));
	}
	else {
		uint32_t toproduce;
		uint8_t out_buffer[BLAKE2B_OUTBYTES];
		uint8_t in_buffer[BLAKE2B_OUTBYTES];
		TRY(blake2b_init(&blake_state, BLAKE2B_OUTBYTES));
		TRY(blake2b_update(&blake_state, outlen_bytes, sizeof(outlen_bytes)));
		TRY(blake2b_update(&blake_state, in, inlen));
		TRY(blake2b_final(&blake_state, out_buffer, BLAKE2B_OUTBYTES));
		memcpy(out, out_buffer, BLAKE2B_OUTBYTES / 2);
		out += BLAKE2B_OUTBYTES / 2;
		toproduce = (uint32_t)outlen - BLAKE2B_OUTBYTES / 2;

		while (toproduce > BLAKE2B_OUTBYTES) {
			memcpy(in_buffer, out_buffer, BLAKE2B_OUTBYTES);
			TRY(blake2b(out_buffer, BLAKE2B_OUTBYTES, in_buffer,
				BLAKE2B_OUTBYTES, NULL, 0));
			memcpy(out, out_buffer, BLAKE2B_OUTBYTES / 2);
			out += BLAKE2B_OUTBYTES / 2;
			toproduce -= BLAKE2B_OUTBYTES / 2;
		}

		memcpy(in_buffer, out_buffer, BLAKE2B_OUTBYTES);
		TRY(blake2b(out_buffer, toproduce, in_buffer, BLAKE2B_OUTBYTES, NULL,
			0));
		memcpy(out, out_buffer, toproduce);
	}
fail:
	//clear_internal_memory(&blake_state, sizeof(blake_state));
	return ret;
#undef TRY
}